

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTcSymLocal::gen_code(CTcSymLocal *this,int discard)

{
  ushort uVar1;
  int iVar2;
  CTcCodeStream *this_00;
  CTcGenTarg *pCVar3;
  int iVar4;
  size_t in_RCX;
  undefined1 local_1a;
  undefined1 local_19;
  
  if (discard == 0) {
    uVar1 = *(ushort *)&(this->super_CTcSymLocalBase).field_0x64;
    if ((uVar1 & 0x10) == 0) {
      s_gen_code_getlcl((this->super_CTcSymLocalBase).var_num_,uVar1 & 1);
    }
    else {
      if ((this->super_CTcSymLocalBase).ctx_var_num_ < 0x100) {
        iVar4 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
        if (iVar4 < 0x100) {
          CTcGenTarg::write_op(G_cg,0xbb);
          local_1a = (undefined1)(this->super_CTcSymLocalBase).ctx_var_num_;
          CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_1a,(void *)0x1,in_RCX);
          this_00 = G_cs;
          iVar4 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
          local_19 = (undefined1)iVar4;
          CTcDataStream::write(&this_00->super_CTcDataStream,(int)&local_19,(void *)0x1,in_RCX);
          pCVar3 = G_cg;
          iVar2 = G_cg->sp_depth_;
          iVar4 = iVar2 + 1;
          G_cg->sp_depth_ = iVar4;
          if (pCVar3->max_sp_depth_ <= iVar2) {
            pCVar3->max_sp_depth_ = iVar4;
          }
          goto LAB_00216875;
        }
      }
      s_gen_code_getlcl((this->super_CTcSymLocalBase).ctx_var_num_,0);
      iVar4 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
      CTPNConst::s_gen_code_int((long)iVar4);
      CTcGenTarg::write_op(G_cg,0xba);
      G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    }
  }
LAB_00216875:
  CTcSymLocalBase::set_val_used(&this->super_CTcSymLocalBase,1);
  return;
}

Assistant:

void CTcSymLocal::gen_code(int discard)
{
    /* generate code to push the local, if we're not discarding it */
    if (!discard)
    {
        /* 
         *   generate as a context local if required, otherwise as an
         *   ordinary local variable 
         */
        if (is_ctx_local_)
        {
            /* generate the context array lookup */
            if (ctx_var_num_ <= 255 && get_ctx_arr_idx() <= 255)
            {
                /* we can do this whole operation with one instruction */
                G_cg->write_op(OPC_IDXLCL1INT8);
                G_cs->write((uchar)ctx_var_num_);
                G_cs->write((uchar)get_ctx_arr_idx());

                /* this pushes one value */
                G_cg->note_push();
            }
            else
            {
                /* get our context array */
                s_gen_code_getlcl(ctx_var_num_, FALSE);
                
                /* get our value from the context array */
                CTPNConst::s_gen_code_int(get_ctx_arr_idx());
                G_cg->write_op(OPC_INDEX);
                
                /* the INDEX operation removes two values and pushes one */
                G_cg->note_pop();
            }
        }
        else
        {
            /* generate as an ordinary local */
            s_gen_code_getlcl(get_var_num(), is_param());
        }
    }

    /* 
     *   Mark the value as referenced, whether or not we're generating the
     *   code - the value has been logically referenced in the program
     *   even if the result of evaluating it isn't needed.  
     */
    set_val_used(TRUE);
}